

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O2

int quicly_sentmap_prepare
              (quicly_sentmap_t *map,uint64_t packet_number,int64_t now,uint8_t ack_epoch)

{
  st_quicly_sent_block_t *psVar1;
  size_t sVar2;
  
  if (map->_pending_packet != (quicly_sent_t *)0x0) {
    __assert_fail("map->_pending_packet == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                  ,0x61,"int quicly_sentmap_prepare(quicly_sentmap_t *, uint64_t, int64_t, uint8_t)"
                 );
  }
  psVar1 = map->tail;
  if ((psVar1 == (st_quicly_sent_block_t *)0x0) || (sVar2 = psVar1->next_insert_at, sVar2 == 0x10))
  {
    psVar1 = quicly_sentmap__new_block(map);
    if (psVar1 == (st_quicly_sent_block_t *)0x0) {
      map->_pending_packet = (quicly_sent_t *)0x0;
      return 0x201;
    }
    sVar2 = psVar1->next_insert_at;
  }
  psVar1->next_insert_at = sVar2 + 1;
  psVar1->num_entries = psVar1->num_entries + 1;
  psVar1->entries[sVar2].acked = quicly_sentmap__type_packet;
  map->_pending_packet = psVar1->entries + sVar2;
  psVar1->entries[sVar2].data.packet.packet_number = packet_number;
  psVar1->entries[sVar2].data.packet.sent_at = now;
  psVar1->entries[sVar2].data.packet.ack_epoch = ack_epoch;
  *(undefined1 *)((long)&psVar1->entries[sVar2].data + 0x11) = 0;
  psVar1->entries[sVar2].data.packet.cc_bytes_in_flight = 0;
  return 0;
}

Assistant:

int quicly_sentmap_prepare(quicly_sentmap_t *map, uint64_t packet_number, int64_t now, uint8_t ack_epoch)
{
    assert(map->_pending_packet == NULL);

    if ((map->_pending_packet = quicly_sentmap_allocate(map, quicly_sentmap__type_packet)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    map->_pending_packet->data.packet = (quicly_sent_packet_t){packet_number, now, ack_epoch};
    return 0;
}